

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::
add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,Type option,Type rest,Type rest_1,
          Type rest_2,Type rest_3,Type rest_4)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  value_type local_48;
  Type option_local;
  FeatureSet feature_local;
  
  local_48.id = option.id;
  option_local.id._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&option_local.id + 4));
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(this_00,&local_48);
  pFVar1 = add<wasm::Type,wasm::Type,wasm::Type,wasm::Type>
                     (this,option_local.id._4_4_,rest,rest_1,rest_2,rest_3,rest_4);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }